

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupUnsolvedOutputs(Aig_Man_t *p,int fAddRegs)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  int local_68;
  int local_64;
  int local_38;
  int local_34;
  int nOuts;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int fAddRegs_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x4b4,"Aig_Man_t *Aig_ManDupUnsolvedOutputs(Aig_Man_t *, int)");
  }
  if (p->nConstrs < 1) {
    iVar1 = Aig_ManObjNumMax(p);
    p_local = Aig_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_local->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_local->pSpec = pcVar3;
    Aig_ManCleanData(p);
    pAVar4 = Aig_ManConst1(p_local);
    pAVar5 = Aig_ManConst1(p);
    (pAVar5->field_5).pData = pAVar4;
    for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar6 = Vec_PtrEntry(p->vCis,local_34);
      pAVar4 = Aig_ObjCreateCi(p_local);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    }
    local_38 = 0;
    local_34 = 0;
    while( true ) {
      iVar1 = Aig_ManCoNum(p);
      iVar2 = Aig_ManRegNum(p);
      if (iVar1 - iVar2 <= local_34) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
      pAVar4 = Aig_ObjFanin0(pAVar4);
      pAVar5 = Aig_ManConst1(p);
      local_38 = (uint)(pAVar4 != pAVar5) + local_38;
      local_34 = local_34 + 1;
    }
    if (fAddRegs == 0) {
      local_64 = 0;
    }
    else {
      local_64 = p->nRegs;
    }
    p_local->nRegs = local_64;
    if (fAddRegs == 0) {
      local_68 = p->nTruePis + p->nRegs;
    }
    else {
      local_68 = p->nTruePis;
    }
    p_local->nTruePis = local_68;
    p_local->nTruePos = local_38;
    for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        pAVar7 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(p_local,pAVar5,pAVar7);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Aig_ManCoNum(p);
      iVar2 = Aig_ManRegNum(p);
      if (iVar1 - iVar2 <= local_34) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
      pAVar5 = Aig_ObjFanin0(pAVar4);
      pAVar7 = Aig_ManConst1(p);
      if (pAVar5 != pAVar7) {
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Aig_ObjCreateCo(p_local,pAVar4);
      }
      local_34 = local_34 + 1;
    }
    if (fAddRegs != 0) {
      local_34 = Aig_ManCoNum(p);
      iVar1 = Aig_ManRegNum(p);
      for (local_34 = local_34 - iVar1; iVar1 = Vec_PtrSize(p->vCos), local_34 < iVar1;
          local_34 = local_34 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Aig_ObjCreateCo(p_local,pAVar4);
      }
    }
    Aig_ManCleanup(p_local);
  }
  else {
    printf("The AIG manager should have no constraints.\n");
    p_local = (Aig_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Aig_Man_t * Aig_ManDupUnsolvedOutputs( Aig_Man_t * p, int fAddRegs )
{ 
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i, nOuts = 0;
    assert( Aig_ManRegNum(p) > 0 );
    if ( p->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the POs
    nOuts = 0;
    Aig_ManForEachPoSeq( p, pObj, i )
        nOuts += ( Aig_ObjFanin0(pObj) != Aig_ManConst1(p) );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = nOuts;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    Aig_ManForEachPoSeq( p, pObj, i )
        if ( Aig_ObjFanin0(pObj) != Aig_ManConst1(p) )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}